

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm7tdmi.c
# Opt level: O3

int arm7tdmi_step(arm7tdmi_t *state)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uint16_t uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  undefined4 uVar12;
  uint uVar13;
  uint32_t uVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  uint32_t *puVar18;
  char *pcVar19;
  thumbinstr_t tVar20;
  char *pcVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  arminstr_t instr;
  thumbinstr_t instr_1;
  
  if ((state->irq == true) && (((uint)state->cpsr & 0x80) == 0)) {
    handle_irq(state);
  }
  if ((dbg_window_visible == true) && (tick_on == INSTRUCTION)) {
    actual_dbg_tick();
  }
  state->this_step_ticks = 0;
  if (((2 < gba_log_verbosity) &&
      (printf("[DEBUG] r0:  %08X   r1: %08X   r2: %08X   r3: %08X\n",(ulong)state->r[0],
              (ulong)state->r[1],(ulong)state->r[2],(ulong)state->r[3]), 2 < gba_log_verbosity)) &&
     (printf("[DEBUG] r4:  %08X   r5: %08X   r6: %08X   r7: %08X\n",(ulong)state->r[4],
             (ulong)state->r[5],(ulong)state->r[6],(ulong)state->r[7]), 2 < gba_log_verbosity)) {
    puVar2 = state->highreg_fiq;
    puVar1 = state->highreg_fiq + 1;
    puVar3 = state->highreg_fiq + 2;
    puVar18 = state->highreg_fiq + 3;
    if (((state->cpsr).raw & 0x1f) != 0x11) {
      puVar18 = state->r + 0xb;
      puVar1 = state->r + 9;
      puVar2 = state->r + 8;
      puVar3 = state->r + 10;
    }
    printf("[DEBUG] r8:  %08X   r9: %08X  r10: %08X  r11: %08X\n",(ulong)*puVar2,(ulong)*puVar1,
           (ulong)*puVar3,(ulong)*puVar18);
    if (2 < gba_log_verbosity) {
      uVar5 = (state->cpsr).raw & 0x1f;
      if (uVar5 == 0x11) {
        uVar11 = (ulong)state->highreg_fiq[4];
        lVar7 = 0x9c;
        lVar8 = 0x84;
      }
      else {
        uVar11 = (ulong)state->r[0xc];
        switch(uVar5) {
        case 0x12:
          lVar7 = 0xa8;
          lVar8 = 0x90;
          break;
        case 0x13:
          lVar7 = 0xa0;
          lVar8 = 0x88;
          break;
        default:
          lVar7 = 0x98;
          lVar8 = 0x80;
          break;
        case 0x17:
          lVar7 = 0xa4;
          lVar8 = 0x8c;
          break;
        case 0x1b:
          lVar7 = 0xac;
          lVar8 = 0x94;
        }
      }
      uVar12 = 0x122eea;
      printf("[DEBUG] r12: %08X  r13: %08X  r14: %08X  r15: %08X\n",uVar11,
             (ulong)*(uint *)((long)state->r + lVar8 + -0x38),
             (ulong)*(uint *)((long)state->r + lVar7 + -0x38),(ulong)state->pc);
      if (2 < gba_log_verbosity) {
        uVar5 = (state->cpsr).raw;
        pcVar10 = "N";
        if (-1 < (int)uVar5) {
          pcVar10 = "-";
        }
        pcVar9 = "Z";
        if ((uVar5 >> 0x1e & 1) == 0) {
          pcVar9 = "-";
        }
        pcVar15 = "C";
        if ((uVar5 >> 0x1d & 1) == 0) {
          pcVar15 = "-";
        }
        auVar22._4_4_ = uVar5;
        auVar22._0_4_ = uVar5;
        auVar22._8_4_ = uVar5;
        auVar22._12_4_ = uVar5;
        auVar22 = auVar22 & _DAT_00122a80;
        auVar23._0_4_ = -(uint)(auVar22._0_4_ == 0);
        auVar23._4_4_ = -(uint)(auVar22._4_4_ == 0);
        auVar23._8_4_ = -(uint)(auVar22._8_4_ == 0);
        auVar23._12_4_ = -(uint)(auVar22._12_4_ == 0);
        uVar13 = movmskps(uVar12,auVar23);
        pcVar16 = "V";
        if ((uVar13 & 8) != 0) {
          pcVar16 = "-";
        }
        pcVar17 = "I";
        if ((uVar13 & 4) != 0) {
          pcVar17 = "-";
        }
        pcVar19 = "F";
        if ((uVar13 & 2) != 0) {
          pcVar19 = "-";
        }
        pcVar21 = "T";
        if ((uVar13 & 1) != 0) {
          pcVar21 = "-";
        }
        printf("[DEBUG] cpsr: %08X [%s%s%s%s%s%s%s]\n",(ulong)uVar5,pcVar10,pcVar9,pcVar15,pcVar16,
               pcVar17,pcVar19,pcVar21);
      }
    }
  }
  if (((uint)state->cpsr & 0x20) != 0) {
    uVar5 = state->pipeline[0];
    tVar20 = (thumbinstr_t)(uVar5 & 0xffff);
    state->pipeline[0] = state->pipeline[1];
    uVar14 = state->pc + 2;
    state->pc = uVar14;
    uVar4 = (*state->read_half)(uVar14,ACCESS_NONSEQUENTIAL);
    state->pipeline[1] = (uint)uVar4;
    state->instr = (uint32_t)tVar20;
    instr_1 = tVar20;
    if (1 < gba_log_verbosity) {
      uVar13 = state->pc - 4;
      disassemble_thumb(uVar13,(uint16_t)uVar5,state->disassembled,0x32);
      if (1 < gba_log_verbosity) {
        printf("\x1b[0;36m[INFO]  [THM] [%s] 0x%08X: [    0x%04X] %s\n\x1b[0;m",
               MODE_NAMES + ((state->cpsr).raw & 0x1f),(ulong)uVar13,(ulong)(uint)tVar20,
               state->disassembled);
      }
    }
    (*thm_lut[(uint)tVar20 >> 6])(state,&instr_1);
    return state->this_step_ticks + (uint)(state->this_step_ticks == 0);
  }
  uVar5 = state->pipeline[0];
  state->pipeline[0] = state->pipeline[1];
  uVar14 = state->pc + 4;
  state->pc = uVar14;
  uVar14 = (*state->read_word)(uVar14,ACCESS_NONSEQUENTIAL);
  state->pipeline[1] = uVar14;
  state->instr = uVar5;
  if (1 < gba_log_verbosity) {
    uVar13 = state->pc - 8;
    disassemble_arm(uVar13,uVar5,state->disassembled,0x32);
    if ((1 < gba_log_verbosity) &&
       (printf("\x1b[0;36m[INFO]  [ARM] [%s] 0x%08X: [0x%08X] %s\n\x1b[0;m",
               MODE_NAMES + ((state->cpsr).raw & 0x1f),(ulong)uVar13,(ulong)uVar5,
               state->disassembled), 2 < gba_log_verbosity)) {
      printf("[DEBUG] cond: %d\n",(ulong)(uVar5 >> 0x1c));
    }
  }
  iVar6 = (*(code *)(&DAT_00122ab8 + *(int *)(&DAT_00122ab8 + (ulong)(uVar5 >> 0x1c) * 4)))();
  return iVar6;
}

Assistant:

int arm7tdmi_step(arm7tdmi_t* state) {
    if (state->irq && !state->cpsr.disable_irq) {
        handle_irq(state);
    }

    dbg_tick(INSTRUCTION);

    state->this_step_ticks = 0;
    logdebug("r0:  %08X   r1: %08X   r2: %08X   r3: %08X", get_register(state, 0), get_register(state, 1), get_register(state, 2), get_register(state, 3))
    logdebug("r4:  %08X   r5: %08X   r6: %08X   r7: %08X", get_register(state, 4), get_register(state, 5), get_register(state, 6), get_register(state, 7))
    logdebug("r8:  %08X   r9: %08X  r10: %08X  r11: %08X", get_register(state, 8), get_register(state, 9), get_register(state, 10), get_register(state, 11))
    logdebug("r12: %08X  r13: %08X  r14: %08X  r15: %08X", get_register(state, 12), get_register(state, 13), get_register(state, 14), get_register(state, 15))
    logdebug("cpsr: %08X [%s%s%s%s%s%s%s]", state->cpsr.raw, cpsrflag(state->cpsr.N, "N"), cpsrflag(state->cpsr.Z, "Z"),
             cpsrflag(state->cpsr.C, "C"), cpsrflag(state->cpsr.V, "V"), cpsrflag(state->cpsr.disable_irq, "I"),
             cpsrflag(state->cpsr.disable_fiq, "F"), cpsrflag(state->cpsr.thumb, "T"))

     int cycles;
     if (state->cpsr.thumb) {
         thumbinstr_t instr = next_thumb_instr(state);
         state->instr = instr.raw;
         word adjusted_pc = state->pc - 4;
         if (gba_log_verbosity >= LOG_VERBOSITY_INFO) {
             disassemble_thumb(adjusted_pc, instr.raw, (char *) &state->disassembled, sizeof(state->disassembled));
             loginfo("[THM] [%s] 0x%08X: [    0x%04X] %s", MODE_NAMES[state->cpsr.mode], adjusted_pc, instr.raw, state->disassembled)
         }
         cycles = thumb_mode_step(state, &instr);
     } else {
         arminstr_t instr = next_arm_instr(state);
         state->instr = instr.raw;
         word adjusted_pc = state->pc - 8;
         if (gba_log_verbosity >= LOG_VERBOSITY_INFO) {
             disassemble_arm(adjusted_pc, instr.raw, (char *) &state->disassembled, sizeof(state->disassembled));
             loginfo("[ARM] [%s] 0x%08X: [0x%08X] %s", MODE_NAMES[state->cpsr.mode], adjusted_pc, instr.raw, state->disassembled)
         }
         cycles = arm_mode_step(state, &instr);
     }

    // Assume a step of 0 cycles is an unknown number of cycles. Consider it 1 cycle
     return cycles == 0 ? 1 : cycles;
}